

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCache.c
# Opt level: O1

int cuddInitCache(DdManager *unique,uint cacheSize,uint maxCacheSize)

{
  double dVar1;
  uint uVar2;
  ulong uVar3;
  DdCache *pDVar4;
  ptruint *ppVar5;
  int iVar6;
  uint uVar7;
  
  uVar7 = unique->slots;
  uVar2 = uVar7 >> 1;
  uVar3 = (ulong)uVar2;
  if (uVar2 <= cacheSize) {
    uVar3 = (ulong)cacheSize;
  }
  iVar6 = 0;
  if (1 < (uint)uVar3) {
    iVar6 = 0;
    do {
      iVar6 = iVar6 + 1;
      uVar2 = (uint)uVar3;
      uVar3 = uVar3 >> 1;
    } while (3 < uVar2);
  }
  uVar2 = 1 << ((byte)iVar6 & 0x1f);
  pDVar4 = (DdCache *)malloc((ulong)uVar2 * 0x28 + 0x50);
  unique->acache = pDVar4;
  if (pDVar4 == (DdCache *)0x0) {
    unique->errorCode = CUDD_MEMORY_OUT;
    iVar6 = 0;
  }
  else {
    pDVar4 = (DdCache *)((long)&pDVar4->f + (ulong)(0x20 - ((uint)pDVar4 & 0x1f) & 0xfffffff8));
    unique->cache = pDVar4;
    if (((ulong)pDVar4 & 0x1f) != 0) {
      __assert_fail("((ptruint) unique->cache & (32 - 1)) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/cudd/cuddCache.c"
                    ,0xac,"int cuddInitCache(DdManager *, unsigned int, unsigned int)");
    }
    unique->memused = unique->memused + (ulong)(uVar2 + 1) * 0x28;
    unique->cacheSlots = uVar2;
    uVar7 = uVar7 << 2;
    if (maxCacheSize <= uVar7) {
      uVar7 = maxCacheSize;
    }
    unique->cacheShift = 0x20 - iVar6;
    unique->maxCacheHard = maxCacheSize;
    unique->cacheSlack = (-2 << ((byte)iVar6 & 0x1f)) + uVar7;
    Cudd_SetMinHit(unique,0x1e);
    uVar3 = (ulong)uVar2;
    dVar1 = (double)(int)((double)uVar3 * unique->minHit + 1.0);
    unique->cacheMisses = dVar1;
    unique->cacheHits = 0.0;
    unique->totCachehits = 0.0;
    unique->totCacheMisses = -dVar1;
    unique->cachecollisions = 0.0;
    unique->cacheinserts = 0.0;
    unique->cacheLastInserts = 0.0;
    unique->cachedeletions = 0.0;
    ppVar5 = &unique->cache->h;
    do {
      *ppVar5 = 0;
      ppVar5[1] = 0;
      ppVar5 = ppVar5 + 5;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

int
cuddInitCache(
  DdManager * unique /* unique table */,
  unsigned int cacheSize /* initial size of the cache */,
  unsigned int maxCacheSize /* cache size beyond which no resizing occurs */)
{
    int i;
    unsigned int logSize;
#ifndef DD_CACHE_PROFILE
    DdNodePtr *mem;
    ptruint offset;
#endif

    /* Round cacheSize to largest power of 2 not greater than the requested
    ** initial cache size. */
    logSize = cuddComputeFloorLog2(ddMax(cacheSize,unique->slots/2));
    cacheSize = 1 << logSize;
//    unique->acache = ABC_ALLOC(DdCache,cacheSize+1);
    unique->acache = ABC_ALLOC(DdCache,cacheSize+2);
    if (unique->acache == NULL) {
        unique->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }
    /* If the size of the cache entry is a power of 2, we want to
    ** enforce alignment to that power of two. This happens when
    ** DD_CACHE_PROFILE is not defined. */
#ifdef DD_CACHE_PROFILE
    unique->cache = unique->acache;
    unique->memused += (cacheSize) * sizeof(DdCache);
#else
    mem = (DdNodePtr *) unique->acache;
//    offset = (ptruint) mem & (sizeof(DdCache) - 1);
//    mem += (sizeof(DdCache) - offset) / sizeof(DdNodePtr);
    offset = (ptruint) mem & (32 - 1);
    mem += (32 - offset) / sizeof(DdNodePtr);
    unique->cache = (DdCache *) mem;
//    assert(((ptruint) unique->cache & (sizeof(DdCache) - 1)) == 0);
    assert(((ptruint) unique->cache & (32 - 1)) == 0);
    unique->memused += (cacheSize+1) * sizeof(DdCache);
#endif
    unique->cacheSlots = cacheSize;
    unique->cacheShift = sizeof(int) * 8 - logSize;
    unique->maxCacheHard = maxCacheSize;
    /* If cacheSlack is non-negative, we can resize. */
    unique->cacheSlack = (int) ddMin(maxCacheSize,
        DD_MAX_CACHE_TO_SLOTS_RATIO*unique->slots) -
        2 * (int) cacheSize;
    Cudd_SetMinHit(unique,DD_MIN_HIT);
    /* Initialize to avoid division by 0 and immediate resizing. */
    unique->cacheMisses = (double) (int) (cacheSize * unique->minHit + 1);
    unique->cacheHits = 0;
    unique->totCachehits = 0;
    /* The sum of cacheMisses and totCacheMisses is always correct,
    ** even though cacheMisses is larger than it should for the reasons
    ** explained above. */
    unique->totCacheMisses = -unique->cacheMisses;
    unique->cachecollisions = 0;
    unique->cacheinserts = 0;
    unique->cacheLastInserts = 0;
    unique->cachedeletions = 0;

    /* Initialize the cache */
    for (i = 0; (unsigned) i < cacheSize; i++) {
        unique->cache[i].h = 0; /* unused slots */
        unique->cache[i].data = NULL; /* invalid entry */
#ifdef DD_CACHE_PROFILE
        unique->cache[i].count = 0;
#endif
    }

    return(1);

}